

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>::
inf_or_nan_writer::operator()(inf_or_nan_writer *this,counting_iterator<char> *it)

{
  char *pcVar1;
  size_t *in_RSI;
  char *in_RDI;
  counting_iterator<char> cVar2;
  type tVar3;
  undefined7 in_stack_ffffffffffffff88;
  char cVar4;
  size_t in_stack_ffffffffffffffb8;
  undefined8 in_stack_ffffffffffffffc0;
  counting_iterator<char> local_20;
  size_t *local_10;
  
  local_10 = in_RSI;
  if (*in_RDI != '\0') {
    cVar4 = *in_RDI;
    cVar2 = internal::counting_iterator<char>::operator++
                      ((counting_iterator<char> *)CONCAT17(cVar4,in_stack_ffffffffffffff88),0);
    local_20.count_ = cVar2.count_;
    local_20.blackhole_ = cVar2.blackhole_;
    pcVar1 = internal::counting_iterator<char>::operator*(&local_20);
    *pcVar1 = cVar4;
  }
  cVar2._8_8_ = in_stack_ffffffffffffffc0;
  cVar2.count_ = in_stack_ffffffffffffffb8;
  tVar3 = internal::copy_str<char,char_const*,fmt::v5::internal::counting_iterator<char>>
                    ((char *)local_10[1],(char *)*local_10,cVar2);
  *local_10 = tVar3.count_;
  *(char *)(local_10 + 1) = tVar3.blackhole_;
  return;
}

Assistant:

void operator()(It &&it) const {
      if (sign)
        *it++ = static_cast<char_type>(sign);
      it = internal::copy_str<char_type>(
            str, str + static_cast<std::size_t>(INF_SIZE), it);
    }